

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitGraph.c
# Opt level: O0

int * Kit_TruthTest(char *pFileName)

{
  int iVar1;
  uint nVars_00;
  int iVar2;
  uint nFuncs_00;
  abctime aVar3;
  uint *pArray;
  int *piVar4;
  abctime aVar5;
  int *pResult;
  uint *pA;
  int nFuncs;
  int nVars;
  int nFileSize;
  int i;
  abctime clk;
  char *pFileName_local;
  
  aVar3 = Abc_Clock();
  iVar1 = Extra_FileSize(pFileName);
  nVars_00 = Kit_TruthFindVarNum(pFileName);
  iVar2 = Abc_TruthWordNum(nVars_00);
  nFuncs_00 = (iVar1 / 4) / iVar2;
  pArray = (uint *)Extra_FileReadContents(pFileName);
  piVar4 = Kit_TruthStatsArray(pArray,nVars_00,nFuncs_00);
  printf("Finished proceessing %d functions with %d variables. ",(ulong)nFuncs_00,(ulong)nVars_00);
  aVar5 = Abc_Clock();
  Abc_PrintTime(1,"Time",aVar5 - aVar3);
  if (pArray != (uint *)0x0) {
    free(pArray);
  }
  for (nVars = 0; nVars < 5; nVars = nVars + 1) {
    printf("Function %3d :  AND2 = %3d  Lev = %3d\n",(ulong)(uint)nVars,
           (ulong)(piVar4[nVars] & 0xffff),(ulong)(uint)(piVar4[nVars] >> 0x10));
  }
  return piVar4;
}

Assistant:

int * Kit_TruthTest( char * pFileName )
{
    abctime clk   = Abc_Clock(); int i;
    int nFileSize = Extra_FileSize( pFileName );
    int nVars     = Kit_TruthFindVarNum( pFileName );
    int nFuncs    = nFileSize / 4 / Abc_TruthWordNum(nVars);
    unsigned * pA = (unsigned *)Extra_FileReadContents( pFileName );
    int * pResult = Kit_TruthStatsArray( pA, nVars, nFuncs );
    printf( "Finished proceessing %d functions with %d variables. ", nFuncs, nVars );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    ABC_FREE( pA );
    for ( i = 0; i < 5; i++ )
        printf( "Function %3d :  AND2 = %3d  Lev = %3d\n", i, pResult[i] & 0xFFFF, pResult[i] >> 16 );
    return pResult;
}